

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

bool embree::test_location
               (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *in,ssize_t ipos,
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               *out,ssize_t opos)

{
  float *pfVar1;
  float *pfVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  long lVar6;
  undefined1 auVar7 [16];
  ssize_t sVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (opos < 0) {
    return false;
  }
  pvVar3 = (out->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (in->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (in->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pvVar5 - (long)pvVar4;
  uVar11 = lVar10 >> 5;
  sVar8 = ipos;
  do {
    if ((long)pvVar3->size_active <= opos) {
      return true;
    }
    if (pvVar5 != pvVar4) {
      uVar13 = 1;
      lVar12 = 0x18;
      bVar14 = lVar10 != 0;
      do {
        pfVar1 = (float *)(*(long *)(&pvVar4->field_0x0 + lVar12) + sVar8 * 0x10);
        lVar6 = *(long *)(&pvVar3->field_0x0 + lVar12);
        pfVar2 = (float *)(lVar6 + opos * 0x10);
        auVar15._0_8_ = *(ulong *)pfVar1 & 0x7fffffff7fffffff;
        auVar15._8_4_ = ABS(pfVar1[2]);
        auVar15._12_4_ = ABS(pfVar1[3]);
        auVar16._8_4_ = ABS(pfVar2[2]);
        auVar16._0_8_ = *(ulong *)pfVar2 & 0x7fffffff7fffffff;
        auVar16._12_4_ = ABS(pfVar2[3]);
        auVar16 = maxps(auVar15,auVar16);
        auVar7._4_4_ = -(uint)(auVar16._4_4_ * 0.01 < ABS(pfVar1[1] - pfVar2[1]));
        auVar7._0_4_ = -(uint)(auVar16._0_4_ * 0.01 < ABS(*pfVar1 - *pfVar2));
        auVar7._8_4_ = -(uint)(auVar16._8_4_ * 0.01 < ABS(pfVar1[2] - pfVar2[2]));
        auVar7._12_4_ = -(uint)(auVar16._12_4_ * 0.01 < ABS(pfVar1[3] - pfVar2[3]));
        iVar9 = movmskps((int)lVar6,auVar7);
        if (iVar9 != 0) {
          if (bVar14) {
            return false;
          }
          break;
        }
        bVar14 = uVar13 < uVar11;
        lVar6 = (-(ulong)(uVar11 == 0) - uVar11) + uVar13;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x20;
      } while (lVar6 != 0);
    }
    opos = opos + 1;
    bVar14 = ipos + 3 <= sVar8;
    sVar8 = sVar8 + 1;
    if (bVar14) {
      return true;
    }
  } while( true );
}

Assistant:

bool test_location(const std::vector<avector<Vec3ff>>& in, ssize_t ipos, std::vector<avector<Vec3ff>>& out, ssize_t opos)
  {
    if (opos < 0) 
      return false;

    for (ssize_t i=ipos, j=opos; i<ipos+4 && j<(ssize_t)out[0].size(); i++, j++) {
      for (size_t k=0; k<in.size(); k++) {
        if (any(abs((vfloat4)in[k][i].m128-(vfloat4)out[k][j].m128) > 0.01f*(vfloat4)max(abs(in[k][i]),abs(out[k][j])).m128))
          return false;
      }
    }
    return true;
  }